

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_class_desc(parser *p)

{
  void *pvVar1;
  long lVar2;
  char *s2;
  char *pcVar3;
  class_spell *spell;
  class_book *book;
  player_class *c;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (*(int *)((long)pvVar1 + 0xf8) < 1) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    if ((*(long *)((long)pvVar1 + 0x100) == 0) ||
       (class_max_books < *(wchar_t *)((long)pvVar1 + 0xf8))) {
      __assert_fail("c->magic.books && c->magic.num_books <= class_max_books",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                    ,0xfe2,"enum parser_error parse_class_desc(struct parser *)");
    }
    lVar2 = *(long *)((long)pvVar1 + 0x100) + (long)(*(int *)((long)pvVar1 + 0xf8) + -1) * 0x20;
    if (*(int *)(lVar2 + 0xc) < 1) {
      p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      if ((*(long *)(lVar2 + 0x18) == 0) || (book_max_spells < *(wchar_t *)(lVar2 + 0xc))) {
        __assert_fail("book->spells && book->num_spells <= book_max_spells",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/init.c"
                      ,0xfe8,"enum parser_error parse_class_desc(struct parser *)");
      }
      lVar2 = *(long *)(lVar2 + 0x18) + (long)(*(int *)(lVar2 + 0xc) + -1) * 0x38;
      pcVar3 = *(char **)(lVar2 + 8);
      s2 = parser_getstr(p,"desc");
      pcVar3 = string_append(pcVar3,s2);
      *(char **)(lVar2 + 8) = pcVar3;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_class_desc(struct parser *p) {
	struct player_class *c = parser_priv(p);
	struct class_book *book;
	struct class_spell *spell;

	if (!c) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (c->magic.num_books < 1) {
		/*
		 * Either missing a magic directive for the class or didn't
		 * have a book directive after the magic directive.
		 */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(c->magic.books && c->magic.num_books <= class_max_books);
	book = &c->magic.books[c->magic.num_books - 1];
	if (book->num_spells < 1) {
		/* Missing a spell directive after the book directive. */
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	assert(book->spells && book->num_spells <= book_max_spells);
	spell = &book->spells[book->num_spells - 1];
	spell->text = string_append(spell->text, parser_getstr(p, "desc"));
	return PARSE_ERROR_NONE;
}